

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O3

bool __thiscall
ON_HistoryRecord::GetPolyEdgeValue
          (ON_HistoryRecord *this,int value_id,ON_PolyEdgeHistory **polyedge)

{
  ON_Value *pOVar1;
  bool bVar2;
  
  *polyedge = (ON_PolyEdgeHistory *)0x0;
  bVar2 = false;
  pOVar1 = FindValueHelper(this,value_id,0xd,false);
  if (pOVar1 != (ON_Value *)0x0) {
    if (*(int *)&pOVar1[2]._vptr_ON_Value == 1) {
      *polyedge = *(ON_PolyEdgeHistory **)&pOVar1[1].m_value_id;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool ON_HistoryRecord::GetPolyEdgeValue( int value_id, const ON_PolyEdgeHistory*& polyedge ) const
{
  bool rc = false;
  polyedge = 0;
  const ON_PolyEdgeHistoryValue* v = static_cast<ON_PolyEdgeHistoryValue*>(FindValueHelper(value_id,ON_Value::polyedge_value,0));
  if ( v && 1 == v->m_value.Count())
  {
    polyedge = &v->m_value[0];
    rc = true;
  }
  return rc;
}